

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlElement * __thiscall TiXmlNode::NextSiblingElement(TiXmlNode *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  do {
    this = this->next;
    if (this == (TiXmlNode *)0x0) {
      return (TiXmlElement *)0x0;
    }
    iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[5])(this);
  } while (CONCAT44(extraout_var,iVar1) == 0);
  iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[5])(this);
  return (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

const TiXmlElement* TiXmlNode::NextSiblingElement() const
{
	const TiXmlNode* node;

	for (	node = NextSibling();
			node;
			node = node->NextSibling() )
	{
		if ( node->ToElement() )
			return node->ToElement();
	}
	return 0;
}